

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall
mkvparser::Cluster::ParseBlockGroup(Cluster *this,longlong payload_size,longlong *pos,long *len)

{
  IMkvReader *pReader;
  long lVar1;
  int iVar2;
  ulong size;
  long lVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  uchar flags;
  longlong avail;
  longlong discard_padding;
  longlong total;
  byte local_71;
  long local_70;
  ulong local_68;
  ulong local_60;
  Cluster *local_58;
  longlong local_50;
  longlong local_48;
  longlong local_40;
  long local_38;
  
  lVar3 = *pos;
  pReader = this->m_pSegment->m_pReader;
  iVar2 = (*pReader->_vptr_IMkvReader[1])(pReader,&local_38,&local_70);
  if (iVar2 < 0) {
    uVar7 = (ulong)iVar2;
  }
  else {
    local_58 = this;
    if (local_38 < local_70 && -1 < local_38) {
      __assert_fail("(total < 0) || (avail <= total)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x19a4,
                    "long mkvparser::Cluster::ParseBlockGroup(long long, long long &, long &)");
    }
    lVar6 = payload_size + lVar3;
    uVar7 = 0xfffffffffffffffe;
    if (local_38 < 0 || lVar6 <= local_38) {
      if (local_70 < lVar6) {
        *len = payload_size;
LAB_0012d94c:
        uVar7 = 0xfffffffffffffffd;
      }
      else {
        local_48 = 0;
        lVar5 = *pos;
        local_40 = lVar3;
        local_50 = payload_size;
        while (lVar5 < lVar6) {
          if (local_70 <= lVar5) {
            *len = 1;
            goto LAB_0012d94c;
          }
          size = GetUIntLength(pReader,lVar5,len);
          bVar4 = true;
          if ((long)size < 0) goto LAB_0012db84;
          if (size == 0) {
            lVar3 = *len + *pos;
            if (lVar6 < lVar3) goto LAB_0012d9c2;
            if (local_70 < lVar3) goto LAB_0012d9a6;
            size = ReadID(pReader,*pos,len);
            if ((long)size < 0) goto LAB_0012db84;
            if (size == 0) goto LAB_0012d9c2;
            lVar3 = *pos + *len;
            *pos = lVar3;
            if (local_70 <= lVar3) goto LAB_0012dbe0;
            local_60 = size;
            size = GetUIntLength(pReader,lVar3,len);
            if ((long)size < 0) goto LAB_0012db84;
            if (size != 0) goto LAB_0012d9a6;
            lVar3 = *len + *pos;
            if (lVar6 < lVar3) goto LAB_0012d9c2;
            if (local_70 < lVar3) goto LAB_0012d9a6;
            size = ReadUInt(pReader,*pos,len);
            if (-1 < (long)size) {
              lVar3 = *len;
              lVar5 = *pos + lVar3;
              *pos = lVar5;
              if (lVar5 <= lVar6) {
                if (size == 0) {
                  bVar4 = false;
                  size = uVar7;
                  goto LAB_0012db84;
                }
                if ((-1L << ((char)lVar3 * '\a' & 0x3fU) ^ size) != 0xffffffffffffffff) {
                  if (local_60 != 0xa1) {
                    if (local_60 == 0x75a2) {
                      local_68 = size;
                      size = UnserializeInt(pReader,lVar5,size,&local_48);
                      if ((long)size < 0) goto LAB_0012db84;
                      size = local_68;
                      if (local_60 == 0xa1) goto LAB_0012dada;
                    }
                    lVar3 = *pos + size;
                    *pos = lVar3;
                    bVar4 = lVar6 < lVar3;
                    size = uVar7;
                    if (lVar6 < lVar3) {
                      size = 0xfffffffffffffffe;
                    }
                    goto LAB_0012db84;
                  }
LAB_0012dada:
                  lVar3 = *pos;
                  local_68 = size + lVar3;
                  if ((long)local_68 <= lVar6) {
                    if (lVar3 < local_70) {
                      size = GetUIntLength(pReader,lVar3,len);
                      if ((long)size < 0) goto LAB_0012db84;
                      if (size == 0) {
                        lVar3 = *len + *pos;
                        if (lVar3 <= (long)local_68) {
                          if (local_70 < lVar3) goto LAB_0012d9a6;
                          size = ReadUInt(pReader,*pos,len);
                          if ((long)size < 0) goto LAB_0012db84;
                          if (size != 0) {
                            lVar5 = *len;
                            lVar1 = *pos;
                            lVar3 = lVar1 + lVar5;
                            *pos = lVar3;
                            lVar5 = lVar1 + lVar5 + 2;
                            if (lVar5 <= (long)local_68) {
                              if (local_70 < lVar5) {
                                *len = 2;
                                goto LAB_0012d9a6;
                              }
                              *pos = lVar5;
                              lVar3 = lVar3 + 3;
                              if (lVar3 <= (long)local_68) {
                                if (local_70 < lVar3) goto LAB_0012dbe0;
                                iVar2 = (**pReader->_vptr_IMkvReader)(pReader,lVar5,1,&local_71);
                                if (iVar2 < 0) {
                                  *len = 1;
                                  bVar4 = true;
                                  size = (long)iVar2;
                                }
                                else {
                                  lVar5 = *pos;
                                  lVar3 = lVar5 + 1;
                                  *pos = lVar3;
                                  if (local_70 <= lVar5) {
                                    __assert_fail("pos <= avail",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                                                  ,0x1a49,
                                                  "long mkvparser::Cluster::ParseBlockGroup(long long, long long &, long &)"
                                                 );
                                  }
                                  if (local_68 - lVar3 == 0 || (long)local_68 < lVar3)
                                  goto LAB_0012d9c2;
                                  if ((local_70 < (long)local_68) && ((local_71 & 6) != 0)) {
                                    *len = local_68 - lVar3;
                                    goto LAB_0012d9a6;
                                  }
                                  *pos = local_68;
                                  bVar4 = false;
                                  size = uVar7;
                                }
                                goto LAB_0012db84;
                              }
                            }
                          }
                        }
                        goto LAB_0012d9c2;
                      }
                    }
                    else {
LAB_0012dbe0:
                      *len = 1;
                    }
                    goto LAB_0012d9a6;
                  }
                }
              }
LAB_0012d9c2:
              bVar4 = true;
              size = 0xfffffffffffffffe;
            }
          }
          else {
LAB_0012d9a6:
            bVar4 = true;
            size = 0xfffffffffffffffd;
          }
LAB_0012db84:
          if (bVar4) {
            return size;
          }
          uVar7 = size;
          lVar5 = *pos;
        }
        uVar7 = 0xfffffffffffffffe;
        if ((lVar5 == lVar6) &&
           (uVar7 = CreateBlock(local_58,0xa0,local_40,local_50,local_48), uVar7 == 0)) {
          local_58->m_pos = lVar6;
          uVar7 = 0;
        }
      }
    }
  }
  return uVar7;
}

Assistant:

long Cluster::ParseBlockGroup(long long payload_size, long long& pos,
                              long& len) {
  const long long payload_start = pos;
  const long long payload_stop = pos + payload_size;

  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long total, avail;

  long status = pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  if ((total >= 0) && (payload_stop > total))
    return E_FILE_FORMAT_INVALID;

  if (payload_stop > avail) {
    len = static_cast<long>(payload_size);
    return E_BUFFER_NOT_FULL;
  }

  long long discard_padding = 0;

  while (pos < payload_stop) {
    // parse sub-block element ID

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((pos + len) > payload_stop)
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long id = ReadID(pReader, pos, len);

    if (id < 0)  // error
      return static_cast<long>(id);

    if (id == 0)  // not a valid ID
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume ID field

    // Parse Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((pos + len) > payload_stop)
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume size field

    // pos now points to start of sub-block group payload

    if (pos > payload_stop)
      return E_FILE_FORMAT_INVALID;

    if (size == 0)  // weird
      continue;

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (size == unknown_size)
      return E_FILE_FORMAT_INVALID;

    if (id == libwebm::kMkvDiscardPadding) {
      status = UnserializeInt(pReader, pos, size, discard_padding);

      if (status < 0)  // error
        return status;
    }

    if (id != libwebm::kMkvBlock) {
      pos += size;  // consume sub-part of block group

      if (pos > payload_stop)
        return E_FILE_FORMAT_INVALID;

      continue;
    }

    const long long block_stop = pos + size;

    if (block_stop > payload_stop)
      return E_FILE_FORMAT_INVALID;

    // parse track number

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((pos + len) > block_stop)
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long track = ReadUInt(pReader, pos, len);

    if (track < 0)  // error
      return static_cast<long>(track);

    if (track == 0)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume track number

    if ((pos + 2) > block_stop)
      return E_FILE_FORMAT_INVALID;

    if ((pos + 2) > avail) {
      len = 2;
      return E_BUFFER_NOT_FULL;
    }

    pos += 2;  // consume timecode

    if ((pos + 1) > block_stop)
      return E_FILE_FORMAT_INVALID;

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    unsigned char flags;

    status = pReader->Read(pos, 1, &flags);

    if (status < 0) {  // error or underflow
      len = 1;
      return status;
    }

    ++pos;  // consume flags byte
    assert(pos <= avail);

    if (pos >= block_stop)
      return E_FILE_FORMAT_INVALID;

    const int lacing = int(flags & 0x06) >> 1;

    if ((lacing != 0) && (block_stop > avail)) {
      len = static_cast<long>(block_stop - pos);
      return E_BUFFER_NOT_FULL;
    }

    pos = block_stop;  // consume block-part of block group
    if (pos > payload_stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != payload_stop)
    return E_FILE_FORMAT_INVALID;

  status = CreateBlock(libwebm::kMkvBlockGroup, payload_start, payload_size,
                       discard_padding);
  if (status != 0)
    return status;

  m_pos = payload_stop;

  return 0;  // success
}